

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::SetLogSymlink(LogSeverity severity,char *symlink_basename)

{
  mutex *__mutex;
  LogDestination *pLVar1;
  int line;
  CheckOpString local_80;
  LogMessageFatal local_78;
  
  local_78.super_LogMessage.allocated_._0_4_ = 0;
  local_80.str_ =
       Check_GEImpl<google::LogSeverity,int>
                 ((LogSeverity *)&stack0xffffffffffffff7c,(int *)&local_78,"severity >= 0");
  if (local_80.str_ == (string *)0x0) {
    local_78.super_LogMessage.allocated_._0_4_ = 4;
    local_80.str_ =
         Check_LTImpl<google::LogSeverity,int>
                   ((LogSeverity *)&stack0xffffffffffffff7c,(int *)&local_78,
                    "severity < NUM_SEVERITIES");
    if (local_80.str_ == (string *)0x0) {
      std::mutex::lock((mutex *)log_mutex);
      pLVar1 = log_destination(severity);
      __mutex = &(pLVar1->fileobject_).mutex_;
      std::mutex::lock(__mutex);
      std::__cxx11::string::assign((char *)&(pLVar1->fileobject_).symlink_basename_);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
      return;
    }
    line = 0x291;
  }
  else {
    line = 0x290;
  }
  LogMessageFatal::LogMessageFatal
            (&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
             ,line,&local_80);
  LogMessageFatal::~LogMessageFatal(&local_78);
}

Assistant:

inline void LogDestination::SetLogSymlink(LogSeverity severity,
                                          const char* symlink_basename) {
  CHECK_GE(severity, 0);
  CHECK_LT(severity, NUM_SEVERITIES);
  std::lock_guard<std::mutex> l{log_mutex};
  log_destination(severity)->fileobject_.SetSymlinkBasename(symlink_basename);
}